

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitOneArg(ParseNode *pnode,BOOL fAssignRegs,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo,ProfileId callSiteId,ArgSlot *argIndex,ArgSlot *spreadIndex,
               RegSlot argTempLocation,bool emitProfiledArgout,AuxArray<unsigned_int> *spreadIndices
               )

{
  ushort uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  RegSlot R0;
  undefined4 *puVar5;
  ByteCodeWriter *this;
  
  if (fAssignRegs != 0) {
    Emit(pnode,byteCodeGenerator,funcInfo,0,false,false);
  }
  if (pnode->nop == knopEllipsis) {
    if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1d0d,"(spreadIndices != nullptr)","spreadIndices != nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    uVar1 = *argIndex;
    uVar2 = *spreadIndex;
    *spreadIndex = uVar2 + 1;
    spreadIndices[(ulong)uVar2 + 1].count = uVar1 + 1;
    R0 = FuncInfo::AcquireTmpRegister(funcInfo);
    this = &byteCodeGenerator->m_writer;
    Js::ByteCodeWriter::Reg2(this,LdCustomSpreadIteratorList,R0,pnode->location);
    if (argTempLocation == 0xffffffff) {
      Js::ByteCodeWriter::ArgOut<true>(this,*argIndex + 1,R0,callSiteId,emitProfiledArgout);
    }
    else {
      Js::ByteCodeWriter::Reg2(this,Ld_A,argTempLocation,R0);
    }
    FuncInfo::ReleaseTmpRegister(funcInfo,R0);
  }
  else if (argTempLocation == 0xffffffff) {
    Js::ByteCodeWriter::ArgOut<true>
              (&byteCodeGenerator->m_writer,*argIndex + 1,pnode->location,callSiteId,
               emitProfiledArgout);
  }
  else {
    Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A,argTempLocation,pnode->location);
  }
  *argIndex = *argIndex + 1;
  if (fAssignRegs == 0) {
    return;
  }
  FuncInfo::ReleaseLoc(funcInfo,pnode);
  return;
}

Assistant:

void EmitOneArg(
    ParseNode *pnode,
    BOOL fAssignRegs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::ArgSlot &argIndex,
    Js::ArgSlot &spreadIndex,
    Js::RegSlot argTempLocation,
    bool emitProfiledArgout,
    Js::AuxArray<uint32> *spreadIndices = nullptr
)
{
    bool noArgOuts = argTempLocation != Js::Constants::NoRegister;

    // If this is a put, the arguments have already been evaluated (see EmitReference).
    // We just need to emit the ArgOut instructions.
    if (fAssignRegs)
    {
        Emit(pnode, byteCodeGenerator, funcInfo, false);
    }

    if (pnode->nop == knopEllipsis)
    {
        Assert(spreadIndices != nullptr);
        spreadIndices->elements[spreadIndex++] = argIndex + 1; // account for 'this'
        Js::RegSlot regVal = funcInfo->AcquireTmpRegister();
        byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdCustomSpreadIteratorList, regVal, pnode->location);
        if (noArgOuts)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, argTempLocation, regVal);
        }
        else
        {
            byteCodeGenerator->Writer()->ArgOut<true>(argIndex + 1, regVal, callSiteId, emitProfiledArgout);
        }
        funcInfo->ReleaseTmpRegister(regVal);
    }
    else
    {
        if (noArgOuts)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, argTempLocation, pnode->location);
        }
        else
        {
            byteCodeGenerator->Writer()->ArgOut<true>(argIndex + 1, pnode->location, callSiteId, emitProfiledArgout);
        }
    }
    argIndex++;

    if (fAssignRegs)
    {
        funcInfo->ReleaseLoc(pnode);
    }
}